

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

QString * __thiscall QTemporaryDir::path(QTemporaryDir *this)

{
  long *in_RSI;
  QString *in_RDI;
  
  if ((*(byte *)(*in_RSI + 0x19) & 1) == 0) {
    QString::QString((QString *)0x2f6f9d);
  }
  else {
    QString::QString(in_RDI,in_RDI);
  }
  return in_RDI;
}

Assistant:

QString QTemporaryDir::path() const
{
    return d_ptr->success ? d_ptr->pathOrError : QString();
}